

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1477::run(TestCase1477 *this)

{
  Builder builder_00;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder root;
  Reader oldRoot;
  undefined1 local_188 [48];
  Reader oldSub2;
  Reader oldSub;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = root._builder.dataSize;
  builder_00._builder.pointerCount = root._builder.pointerCount;
  builder_00._builder._38_2_ = root._builder._38_2_;
  initTestMessage(builder_00);
  StructBuilder::asReader(&root._builder);
  reader._reader.capTable = oldRoot._reader.capTable;
  reader._reader.segment = oldRoot._reader.segment;
  reader._reader.data = oldRoot._reader.data;
  reader._reader.pointers = oldRoot._reader.pointers;
  reader._reader.dataSize = oldRoot._reader.dataSize;
  reader._reader.pointerCount = oldRoot._reader.pointerCount;
  reader._reader._38_2_ = oldRoot._reader._38_2_;
  reader._reader.nestingLimit = oldRoot._reader.nestingLimit;
  reader._reader._44_4_ = oldRoot._reader._44_4_;
  checkTestMessage(reader);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField(&oldSub,&oldRoot);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList((Reader *)local_188,&oldRoot);
  ListReader::getStructElement(&oldSub2._reader,(ListReader *)local_188,0);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_188,&builder.super_MessageBuilder);
  root._builder.dataSize = local_188._32_4_;
  root._builder.pointerCount = local_188._36_2_;
  root._builder._38_2_ = local_188._38_2_;
  root._builder.data = (void *)local_188._16_8_;
  root._builder.pointers = (WirePointer *)local_188._24_8_;
  root._builder.segment = (SegmentBuilder *)local_188._0_8_;
  root._builder.capTable = (CapTableBuilder *)local_188._8_8_;
  reader_00._reader.capTable = oldRoot._reader.capTable;
  reader_00._reader.segment = oldRoot._reader.segment;
  reader_00._reader.data = oldRoot._reader.data;
  reader_00._reader.pointers = oldRoot._reader.pointers;
  reader_00._reader.dataSize = oldRoot._reader.dataSize;
  reader_00._reader.pointerCount = oldRoot._reader.pointerCount;
  reader_00._reader._38_2_ = oldRoot._reader._38_2_;
  reader_00._reader.nestingLimit = oldRoot._reader.nestingLimit;
  reader_00._reader._44_4_ = oldRoot._reader._44_4_;
  checkTestMessageAllZero(reader_00);
  reader_01._reader.capTable = oldSub._reader.capTable;
  reader_01._reader.segment = oldSub._reader.segment;
  reader_01._reader.data = oldSub._reader.data;
  reader_01._reader.pointers = oldSub._reader.pointers;
  reader_01._reader.dataSize = oldSub._reader.dataSize;
  reader_01._reader.pointerCount = oldSub._reader.pointerCount;
  reader_01._reader._38_2_ = oldSub._reader._38_2_;
  reader_01._reader.nestingLimit = oldSub._reader.nestingLimit;
  reader_01._reader._44_4_ = oldSub._reader._44_4_;
  checkTestMessageAllZero(reader_01);
  reader_02._reader.capTable = oldSub2._reader.capTable;
  reader_02._reader.segment = oldSub2._reader.segment;
  reader_02._reader.data = oldSub2._reader.data;
  reader_02._reader.pointers = oldSub2._reader.pointers;
  reader_02._reader.dataSize = oldSub2._reader.dataSize;
  reader_02._reader.pointerCount = oldSub2._reader.pointerCount;
  reader_02._reader._38_2_ = oldSub2._reader._38_2_;
  reader_02._reader.nestingLimit = oldSub2._reader.nestingLimit;
  reader_02._reader._44_4_ = oldSub2._reader._44_4_;
  checkTestMessageAllZero(reader_02);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, ZeroOldObject) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();
  initTestMessage(root);

  auto oldRoot = root.asReader();
  checkTestMessage(oldRoot);

  auto oldSub = oldRoot.getStructField();
  auto oldSub2 = oldRoot.getStructList()[0];

  root = builder.initRoot<TestAllTypes>();
  checkTestMessageAllZero(oldRoot);
  checkTestMessageAllZero(oldSub);
  checkTestMessageAllZero(oldSub2);
}